

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

size_t __thiscall spvtools::opt::SENodeHash::operator()(SENodeHash *this,SENode *node)

{
  undefined8 uVar1;
  pointer ppSVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_01;
  size_t sVar5;
  size_type sVar6;
  pointer ppSVar7;
  u32string hash_string;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_68;
  string local_48;
  undefined4 extraout_var_00;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = L'\0';
  SENode::AsString_abi_cxx11_(&local_48,node);
  for (sVar6 = 0; local_48._M_string_length != sVar6; sVar6 = sVar6 + 1) {
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(&local_68,(int)local_48._M_dataplus._M_p[sVar6]);
  }
  std::__cxx11::string::_M_dispose();
  iVar3 = (**node->_vptr_SENode)(node);
  if (iVar3 == 0) {
    iVar3 = (*node->_vptr_SENode[5])(node);
    uVar1 = *(undefined8 *)(CONCAT44(extraout_var,iVar3) + 0x30);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(&local_68,(char32_t)((ulong)uVar1 >> 0x20));
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(&local_68,(char32_t)uVar1);
  }
  iVar3 = (*node->_vptr_SENode[7])(node);
  lVar4 = CONCAT44(extraout_var_00,iVar3);
  if (lVar4 == 0) {
    iVar3 = (**node->_vptr_SENode)(node);
    if (iVar3 == 5) {
      iVar3 = (*node->_vptr_SENode[0xf])(node);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_68,*(char32_t *)(CONCAT44(extraout_var_01,iVar3) + 0x2c));
    }
    ppSVar2 = (node->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar7 = (node->children_).
                   super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppSVar7 != ppSVar2;
        ppSVar7 = ppSVar7 + 1) {
      anon_unknown_15::PushToString<unsigned_long>((unsigned_long)*ppSVar7,&local_68);
    }
  }
  else {
    anon_unknown_15::PushToString<unsigned_long>(*(unsigned_long *)(lVar4 + 0x40),&local_68);
    anon_unknown_15::PushToString<unsigned_long>(*(unsigned_long *)(lVar4 + 0x30),&local_68);
    anon_unknown_15::PushToString<unsigned_long>(*(unsigned_long *)(lVar4 + 0x38),&local_68);
  }
  sVar5 = std::
          hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          ::operator()((hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        *)&local_48,&local_68);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  _M_dispose(&local_68);
  return sVar5;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction* inst) {
  if (inst->opcode() == spv::Op::OpConstantNull) return CreateConstant(0);

  assert(inst->opcode() == spv::Op::OpConstant);
  assert(inst->NumInOperands() == 1);
  int64_t value = 0;

  // Look up the instruction in the constant manager.
  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(inst->result_id());

  if (!constant) return CreateCantComputeNode();

  const analysis::IntConstant* int_constant = constant->AsIntConstant();

  // Exit out if it is a 64 bit integer.
  if (!int_constant || int_constant->words().size() != 1)
    return CreateCantComputeNode();

  if (int_constant->type()->AsInteger()->IsSigned()) {
    value = int_constant->GetS32BitValue();
  } else {
    value = int_constant->GetU32BitValue();
  }

  return CreateConstant(value);
}